

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::InitialPass
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  int iVar2;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__rhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"must be called with at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return false;
    }
LAB_00259790:
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    return false;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    bVar1 = HandleRegexCommand(this,args);
    return bVar1;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    bVar1 = HandleReplaceCommand(this,args);
    return bVar1;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if ((((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)) ||
        (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)) ||
       ((iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0 ||
        (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)))) ||
      ((iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0 ||
       ((iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0 ||
        (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)))))) ||
     ((iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0 ||
      (iVar2 = std::__cxx11::string::compare((char *)__rhs), iVar2 == 0)))) {
    bVar1 = HandleHashCommand(this,args);
    return bVar1;
  }
  iVar2 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)__rhs);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleCompareCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleAsciiCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleConfigureCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleLengthCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleAppendCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandlePrependCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleConcatCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleJoinCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleSubstringCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleStripCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        HandleRepeatCommand(this,args);
        return true;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleRandomCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleFindCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleTimestampCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleMakeCIdentifierCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleGenexStripCommand(this,args);
        return bVar1;
      }
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 == 0) {
        bVar1 = HandleUuidCommand(this,args);
        return bVar1;
      }
      std::operator+(&local_38,"does not recognize sub-command ",__rhs);
      cmCommand::SetError(&this->super_cmCommand,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return false;
      }
      goto LAB_00259790;
    }
    bVar1 = true;
  }
  bVar1 = HandleToUpperLowerCommand(this,args,bVar1);
  return bVar1;
}

Assistant:

bool cmStringCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be called with at least one argument.");
    return false;
  }

  const std::string& subCommand = args[0];
  if (subCommand == "REGEX") {
    return this->HandleRegexCommand(args);
  }
  if (subCommand == "REPLACE") {
    return this->HandleReplaceCommand(args);
  }
  if (subCommand == "MD5" || subCommand == "SHA1" || subCommand == "SHA224" ||
      subCommand == "SHA256" || subCommand == "SHA384" ||
      subCommand == "SHA512" || subCommand == "SHA3_224" ||
      subCommand == "SHA3_256" || subCommand == "SHA3_384" ||
      subCommand == "SHA3_512") {
    return this->HandleHashCommand(args);
  }
  if (subCommand == "TOLOWER") {
    return this->HandleToUpperLowerCommand(args, false);
  }
  if (subCommand == "TOUPPER") {
    return this->HandleToUpperLowerCommand(args, true);
  }
  if (subCommand == "COMPARE") {
    return this->HandleCompareCommand(args);
  }
  if (subCommand == "ASCII") {
    return this->HandleAsciiCommand(args);
  }
  if (subCommand == "CONFIGURE") {
    return this->HandleConfigureCommand(args);
  }
  if (subCommand == "LENGTH") {
    return this->HandleLengthCommand(args);
  }
  if (subCommand == "APPEND") {
    return this->HandleAppendCommand(args);
  }
  if (subCommand == "PREPEND") {
    return this->HandlePrependCommand(args);
  }
  if (subCommand == "CONCAT") {
    return this->HandleConcatCommand(args);
  }
  if (subCommand == "JOIN") {
    return this->HandleJoinCommand(args);
  }
  if (subCommand == "SUBSTRING") {
    return this->HandleSubstringCommand(args);
  }
  if (subCommand == "STRIP") {
    return this->HandleStripCommand(args);
  }
  if (subCommand == "REPEAT") {
    return this->HandleRepeatCommand(args);
  }
  if (subCommand == "RANDOM") {
    return this->HandleRandomCommand(args);
  }
  if (subCommand == "FIND") {
    return this->HandleFindCommand(args);
  }
  if (subCommand == "TIMESTAMP") {
    return this->HandleTimestampCommand(args);
  }
  if (subCommand == "MAKE_C_IDENTIFIER") {
    return this->HandleMakeCIdentifierCommand(args);
  }
  if (subCommand == "GENEX_STRIP") {
    return this->HandleGenexStripCommand(args);
  }
  if (subCommand == "UUID") {
    return this->HandleUuidCommand(args);
  }

  std::string e = "does not recognize sub-command " + subCommand;
  this->SetError(e);
  return false;
}